

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

void Diligent::InputLayoutDesc_To_VkVertexInputStateCI
               (InputLayoutDesc *LayoutDesc,VkPipelineVertexInputStateCreateInfo *VertexInputStateCI
               ,VkPipelineVertexInputDivisorStateCreateInfoEXT *VertexInputDivisorCI,
               array<VkVertexInputBindingDescription,_16UL> *BindingDescriptions,
               array<VkVertexInputAttributeDescription,_16UL> *AttributeDescription,
               array<VkVertexInputBindingDivisorDescription,_16UL> *VertexBindingDivisors)

{
  VkVertexInputBindingDescription *pVVar1;
  uint uVar2;
  uint32_t uVar3;
  LayoutElement *pLVar4;
  array<VkVertexInputBindingDescription,_16UL> *paVar5;
  VkVertexInputRate VVar6;
  VkVertexInputRate VVar7;
  VkFormat VVar8;
  long lVar9;
  uint32_t *puVar10;
  string msg;
  array<int,_16UL> BufferSlot2BindingDescInd;
  string local_c8;
  array<VkVertexInputBindingDescription,_16UL> *local_a8;
  VkPipelineVertexInputDivisorStateCreateInfoEXT *local_a0;
  array<VkVertexInputBindingDivisorDescription,_16UL> *local_98;
  InputLayoutDesc *local_90;
  VkPipelineVertexInputStateCreateInfo *local_88;
  ulong local_80;
  uint32_t local_78 [18];
  
  VertexInputStateCI->sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  VertexInputStateCI->pNext = (void *)0x0;
  VertexInputStateCI->flags = 0;
  VertexInputStateCI->vertexBindingDescriptionCount = 0;
  VertexInputStateCI->pVertexBindingDescriptions = BindingDescriptions->_M_elems;
  VertexInputStateCI->vertexAttributeDescriptionCount = LayoutDesc->NumElements;
  VertexInputStateCI->pVertexAttributeDescriptions = AttributeDescription->_M_elems;
  VertexInputDivisorCI->sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO;
  VertexInputDivisorCI->pNext = (void *)0x0;
  VertexInputDivisorCI->vertexBindingDivisorCount = 0;
  VertexInputDivisorCI->pVertexBindingDivisors = VertexBindingDivisors->_M_elems;
  local_78[0xc] = 0xffffffff;
  local_78[0xd] = 0xffffffff;
  local_78[0xe] = 0xffffffff;
  local_78[0xf] = 0xffffffff;
  local_78[8] = 0xffffffff;
  local_78[9] = 0xffffffff;
  local_78[10] = 0xffffffff;
  local_78[0xb] = 0xffffffff;
  local_78[4] = 0xffffffff;
  local_78[5] = 0xffffffff;
  local_78[6] = 0xffffffff;
  local_78[7] = 0xffffffff;
  local_78[0] = 0xffffffff;
  local_78[1] = 0xffffffff;
  local_78[2] = 0xffffffff;
  local_78[3] = 0xffffffff;
  if (LayoutDesc->NumElements != 0) {
    puVar10 = &AttributeDescription->_M_elems[0].offset;
    lVar9 = 0x24;
    local_80 = 0;
    local_a8 = BindingDescriptions;
    local_a0 = VertexInputDivisorCI;
    local_98 = VertexBindingDivisors;
    local_90 = LayoutDesc;
    local_88 = VertexInputStateCI;
    do {
      paVar5 = local_a8;
      pLVar4 = LayoutDesc->LayoutElements;
      uVar2 = *(uint *)((long)pLVar4 + lVar9 + -0x18);
      if ((int)local_78[uVar2] < 0) {
        uVar3 = local_88->vertexBindingDescriptionCount;
        local_88->vertexBindingDescriptionCount = uVar3 + 1;
        local_78[uVar2] = uVar3;
        local_a8->_M_elems[(int)uVar3].binding = uVar2;
        local_a8->_M_elems[(int)uVar3].stride = *(uint32_t *)((long)pLVar4 + lVar9 + -8);
        VVar6 = LayoutElemFrequencyToVkInputRate
                          (*(INPUT_ELEMENT_FREQUENCY *)((long)pLVar4 + lVar9 + -4));
        paVar5->_M_elems[(int)uVar3].inputRate = VVar6;
        LayoutDesc = local_90;
      }
      uVar3 = local_78[uVar2];
      if (local_a8->_M_elems[(int)uVar3].binding != *(uint32_t *)((long)pLVar4 + lVar9 + -0x18)) {
        FormatString<char[25]>(&local_c8,(char (*) [25])"Inconsistent buffer slot");
        DebugAssertionFailed
                  (local_c8._M_dataplus._M_p,"InputLayoutDesc_To_VkVertexInputStateCI",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x40d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      pVVar1 = local_a8->_M_elems + (int)uVar3;
      if (pVVar1->stride != *(uint32_t *)((long)pLVar4 + lVar9 + -8)) {
        FormatString<char[21]>(&local_c8,(char (*) [21])"Inconsistent strides");
        DebugAssertionFailed
                  (local_c8._M_dataplus._M_p,"InputLayoutDesc_To_VkVertexInputStateCI",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x40e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      VVar6 = pVVar1->inputRate;
      VVar7 = LayoutElemFrequencyToVkInputRate
                        (*(INPUT_ELEMENT_FREQUENCY *)((long)pLVar4 + lVar9 + -4));
      if (VVar6 != VVar7) {
        FormatString<char[38]>(&local_c8,(char (*) [38])"Inconsistent layout element frequency");
        DebugAssertionFailed
                  (local_c8._M_dataplus._M_p,"InputLayoutDesc_To_VkVertexInputStateCI",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x40f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      puVar10[-2] = pVVar1->binding;
      ((VkVertexInputAttributeDescription *)(puVar10 + -3))->location =
           *(uint32_t *)((long)pLVar4 + lVar9 + -0x1c);
      VVar8 = TypeToVkFormat(*(VALUE_TYPE *)((long)pLVar4 + lVar9 + -0x10),
                             *(Uint32 *)((long)pLVar4 + lVar9 + -0x14),
                             *(Bool *)((long)pLVar4 + lVar9 + -0xf));
      puVar10[-1] = VVar8;
      *puVar10 = *(uint32_t *)((long)pLVar4 + lVar9 + -0xc);
      if ((*(char *)((long)pLVar4 + lVar9 + -4) == '\x02') &&
         (uVar3 = *(uint32_t *)((long)&pLVar4->HLSLSemantic + lVar9), uVar3 != 1)) {
        uVar2 = local_a0->vertexBindingDivisorCount;
        local_a0->vertexBindingDivisorCount = uVar2 + 1;
        local_98->_M_elems[uVar2].binding = pVVar1->binding;
        local_98->_M_elems[uVar2].divisor = uVar3;
      }
      local_80 = local_80 + 1;
      lVar9 = lVar9 + 0x28;
      puVar10 = puVar10 + 4;
    } while (local_80 < LayoutDesc->NumElements);
  }
  return;
}

Assistant:

void InputLayoutDesc_To_VkVertexInputStateCI(const InputLayoutDesc&                                                      LayoutDesc,
                                             VkPipelineVertexInputStateCreateInfo&                                       VertexInputStateCI,
                                             VkPipelineVertexInputDivisorStateCreateInfoEXT&                             VertexInputDivisorCI,
                                             std::array<VkVertexInputBindingDescription, MAX_LAYOUT_ELEMENTS>&           BindingDescriptions,
                                             std::array<VkVertexInputAttributeDescription, MAX_LAYOUT_ELEMENTS>&         AttributeDescription,
                                             std::array<VkVertexInputBindingDivisorDescriptionEXT, MAX_LAYOUT_ELEMENTS>& VertexBindingDivisors)
{
    // Vertex input description
    VertexInputStateCI.sType                           = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
    VertexInputStateCI.pNext                           = nullptr;
    VertexInputStateCI.flags                           = 0; // reserved for future use.
    VertexInputStateCI.vertexBindingDescriptionCount   = 0;
    VertexInputStateCI.pVertexBindingDescriptions      = BindingDescriptions.data();
    VertexInputStateCI.vertexAttributeDescriptionCount = LayoutDesc.NumElements;
    VertexInputStateCI.pVertexAttributeDescriptions    = AttributeDescription.data();

    VertexInputDivisorCI.sType                     = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_EXT;
    VertexInputDivisorCI.pNext                     = nullptr;
    VertexInputDivisorCI.vertexBindingDivisorCount = 0;
    VertexInputDivisorCI.pVertexBindingDivisors    = VertexBindingDivisors.data();

    std::array<Int32, MAX_LAYOUT_ELEMENTS> BufferSlot2BindingDescInd;
    BufferSlot2BindingDescInd.fill(-1);
    for (Uint32 elem = 0; elem < LayoutDesc.NumElements; ++elem)
    {
        const LayoutElement& LayoutElem     = LayoutDesc.LayoutElements[elem];
        Int32&               BindingDescInd = BufferSlot2BindingDescInd[LayoutElem.BufferSlot];
        if (BindingDescInd < 0)
        {
            BindingDescInd = VertexInputStateCI.vertexBindingDescriptionCount++;
            VkVertexInputBindingDescription& BindingDesc{BindingDescriptions[BindingDescInd]};
            BindingDesc.binding   = LayoutElem.BufferSlot;
            BindingDesc.stride    = LayoutElem.Stride;
            BindingDesc.inputRate = LayoutElemFrequencyToVkInputRate(LayoutElem.Frequency);
        }

        const VkVertexInputBindingDescription& BindingDesc = BindingDescriptions[BindingDescInd];
        VERIFY(BindingDesc.binding == LayoutElem.BufferSlot, "Inconsistent buffer slot");
        VERIFY(BindingDesc.stride == LayoutElem.Stride, "Inconsistent strides");
        VERIFY(BindingDesc.inputRate == LayoutElemFrequencyToVkInputRate(LayoutElem.Frequency), "Inconsistent layout element frequency");

        VkVertexInputAttributeDescription& AttribDesc{AttributeDescription[elem]};
        AttribDesc.binding  = BindingDesc.binding;
        AttribDesc.location = LayoutElem.InputIndex;
        AttribDesc.format   = TypeToVkFormat(LayoutElem.ValueType, LayoutElem.NumComponents, LayoutElem.IsNormalized);
        AttribDesc.offset   = LayoutElem.RelativeOffset;

        if (LayoutElem.Frequency == INPUT_ELEMENT_FREQUENCY_PER_INSTANCE && LayoutElem.InstanceDataStepRate != 1)
        {
            VkVertexInputBindingDivisorDescriptionEXT& AttribDivisor{VertexBindingDivisors[VertexInputDivisorCI.vertexBindingDivisorCount++]};
            AttribDivisor.binding = BindingDesc.binding;
            AttribDivisor.divisor = LayoutElem.InstanceDataStepRate;
        }
    }
}